

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void walIndexClose(Wal *pWal,int isDelete)

{
  long lVar1;
  
  if (pWal->exclusiveMode == '\x02') {
    if (0 < pWal->nWiData) {
      lVar1 = 0;
      do {
        sqlite3_free(pWal->apWiData[lVar1]);
        pWal->apWiData[lVar1] = (u32 *)0x0;
        lVar1 = lVar1 + 1;
      } while (lVar1 < pWal->nWiData);
    }
    return;
  }
  (*pWal->pDbFd->pMethods->xShmUnmap)(pWal->pDbFd,isDelete);
  return;
}

Assistant:

static void walIndexClose(Wal *pWal, int isDelete){
  if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE ){
    int i;
    for(i=0; i<pWal->nWiData; i++){
      sqlite3_free((void *)pWal->apWiData[i]);
      pWal->apWiData[i] = 0;
    }
  }else{
    sqlite3OsShmUnmap(pWal->pDbFd, isDelete);
  }
}